

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void when_cb(Fl_Choice *i,void *v)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  void **ppvVar5;
  Fl_Widget_Type *q;
  Fl_Type *pFVar6;
  bool bVar7;
  byte bVar8;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    bVar8 = current_widget->o->when_;
    pvVar4 = (void *)0x3e8;
    if ((bVar8 & 0xfd) != 0) {
      pvVar4 = (void *)(ulong)(bVar8 & 0xfffffffd);
    }
    ppvVar5 = &whenmenu[0].user_data_;
    lVar3 = 0;
    do {
      if (pvVar4 == *ppvVar5) {
        Fl_Choice::value(i,(int)lVar3);
        return;
      }
      lVar3 = lVar3 + 1;
      ppvVar5 = ppvVar5 + 7;
    } while (lVar3 != 5);
  }
  else {
    pFVar1 = (i->super_Fl_Menu_).value_;
    if (pFVar1 == (Fl_Menu_Item *)0x0) {
      lVar3 = -1;
    }
    else {
      lVar3 = (long)((int)((ulong)((long)pFVar1 - (long)(i->super_Fl_Menu_).menu_) >> 3) *
                    -0x49249249);
    }
    iVar2 = (int)whenmenu[lVar3].user_data_;
    if ((iVar2 != 0) && (Fl_Type::first != (Fl_Type *)0x0)) {
      bVar8 = (byte)whenmenu[lVar3].user_data_;
      if (iVar2 == 1000) {
        bVar8 = 0;
      }
      bVar7 = true;
      pFVar6 = Fl_Type::first;
      do {
        while ((pFVar6->selected != '\0' &&
               (iVar2 = (*pFVar6->_vptr_Fl_Type[0x17])(pFVar6), iVar2 != 0))) {
          *(byte *)((long)&(pFVar6[1].prev)->header_position + 3) =
               *(byte *)((long)&(pFVar6[1].prev)->header_position + 3) & 2 | bVar8;
          pFVar6 = pFVar6->next;
          bVar7 = false;
          if (pFVar6 == (Fl_Type *)0x0) {
LAB_0018456e:
            set_modflag(1);
            return;
          }
        }
        pFVar6 = pFVar6->next;
      } while (pFVar6 != (Fl_Type *)0x0);
      if (bVar7) {
        return;
      }
      goto LAB_0018456e;
    }
  }
  return;
}

Assistant:

void when_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->when() & (~FL_WHEN_NOT_CHANGED);
    if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(whenmenu)/sizeof(*whenmenu)); j++)
      if (whenmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(whenmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}